

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O0

int ddSymmSiftingAux(DdManager *table,int x,int xLow,int xHigh)

{
  DdHalfWord DVar1;
  uint uVar2;
  DdNode *pDVar3;
  Move *pMVar4;
  int iVar5;
  int iVar6;
  int finalGroupSize;
  int initGroupSize;
  int topbot;
  int i;
  int result;
  int initialSize;
  Move *moveDown;
  Move *moveUp;
  Move *move;
  int xHigh_local;
  int xLow_local;
  int x_local;
  DdManager *table_local;
  
  iVar5 = table->keys - table->isolated;
  _result = (DdNode *)0x0;
  moveDown = (Move *)0x0;
  initGroupSize = x;
  xHigh_local = x;
  if (xHigh - x < x - xLow) {
    while ((xLow < initGroupSize &&
           (iVar6 = cuddSymmCheck(table,initGroupSize + -1,initGroupSize), iVar6 != 0))) {
      uVar2 = table->subtables[initGroupSize + -1].next;
      table->subtables[initGroupSize + -1].next = initGroupSize;
      table->subtables[x].next = uVar2;
      initGroupSize = uVar2;
    }
  }
  else {
    while ((initGroupSize < xHigh &&
           (iVar6 = cuddSymmCheck(table,initGroupSize,initGroupSize + 1), iVar6 != 0))) {
      for (finalGroupSize = initGroupSize + 1;
          (uint)finalGroupSize < table->subtables[finalGroupSize].next;
          finalGroupSize = table->subtables[finalGroupSize].next) {
      }
      table->subtables[finalGroupSize].next = table->subtables[initGroupSize].next;
      table->subtables[initGroupSize].next = initGroupSize + 1;
      initGroupSize = finalGroupSize;
    }
  }
  for (; (uint)xHigh_local < table->subtables[xHigh_local].next;
      xHigh_local = table->subtables[xHigh_local].next) {
  }
  if (xHigh_local == xLow) {
    if (xHigh_local == xHigh) {
      return 1;
    }
    _result = (DdNode *)ddSymmSiftingDown(table,xHigh_local,xHigh);
    if (_result == (DdNode *)0x1) goto LAB_00c1f62e;
    if (_result == (DdNode *)0x0) {
      return 1;
    }
    DVar1 = _result->ref;
    for (initGroupSize = DVar1; (uint)initGroupSize < table->subtables[initGroupSize].next;
        initGroupSize = table->subtables[initGroupSize].next) {
    }
    if (initGroupSize == DVar1) {
      iVar5 = ddSymmSiftingBackward(table,(Move *)_result,iVar5);
    }
    else {
      uVar2 = table->keys;
      iVar5 = table->isolated;
      moveDown = ddSymmSiftingUp(table,DVar1,xLow);
      iVar5 = ddSymmSiftingBackward(table,moveDown,uVar2 - iVar5);
    }
  }
  else {
    iVar6 = cuddNextHigh(table,xHigh_local);
    if (xHigh < iVar6) {
      uVar2 = table->subtables[xHigh_local].next;
      if (uVar2 == xLow) {
        return 1;
      }
      moveDown = ddSymmSiftingUp(table,uVar2,xLow);
      if (moveDown == (Move *)0x1) goto LAB_00c1f62e;
      if (moveDown == (Move *)0x0) {
        return 1;
      }
      DVar1 = moveDown->x;
      if ((xHigh_local - uVar2) + 1 == (DVar1 - table->subtables[(int)DVar1].next) + 1) {
        iVar5 = ddSymmSiftingBackward(table,moveDown,iVar5);
      }
      else {
        uVar2 = table->keys;
        iVar5 = table->isolated;
        _result = (DdNode *)ddSymmSiftingDown(table,DVar1,xHigh);
        iVar5 = ddSymmSiftingBackward(table,(Move *)_result,uVar2 - iVar5);
      }
    }
    else if (xHigh - xHigh_local < xHigh_local - xLow) {
      _result = (DdNode *)ddSymmSiftingDown(table,xHigh_local,xHigh);
      if (_result == (DdNode *)0x1) goto LAB_00c1f62e;
      if (_result == (DdNode *)0x0) {
        for (initGroupSize = xHigh_local; (uint)initGroupSize < table->subtables[initGroupSize].next
            ; initGroupSize = table->subtables[initGroupSize].next) {
        }
        xHigh_local = table->subtables[initGroupSize].next;
      }
      else {
        xHigh_local = _result->ref;
        for (initGroupSize = xHigh_local; (uint)initGroupSize < table->subtables[initGroupSize].next
            ; initGroupSize = table->subtables[initGroupSize].next) {
        }
      }
      iVar6 = initGroupSize - xHigh_local;
      moveDown = ddSymmSiftingUp(table,xHigh_local,xLow);
      if (moveDown == (Move *)0x1) goto LAB_00c1f62e;
      if (moveDown == (Move *)0x0) {
        initGroupSize = xHigh_local;
        for (; (uint)xHigh_local < table->subtables[xHigh_local].next;
            xHigh_local = table->subtables[xHigh_local].next) {
        }
      }
      else {
        xHigh_local = moveDown->x;
        initGroupSize = table->subtables[xHigh_local].next;
      }
      if (iVar6 + 1 == (xHigh_local - initGroupSize) + 1) {
        iVar5 = ddSymmSiftingBackward(table,moveDown,iVar5);
      }
      else {
        while (_result != (DdNode *)0x0) {
          pDVar3 = (_result->type).kids.T;
          _result->ref = 0;
          _result->next = table->nextFree;
          table->nextFree = _result;
          _result = pDVar3;
        }
        uVar2 = table->keys;
        iVar5 = table->isolated;
        _result = (DdNode *)ddSymmSiftingDown(table,xHigh_local,xHigh);
        iVar5 = ddSymmSiftingBackward(table,(Move *)_result,uVar2 - iVar5);
      }
    }
    else {
      xHigh_local = table->subtables[xHigh_local].next;
      moveDown = ddSymmSiftingUp(table,xHigh_local,xLow);
      if (moveDown == (Move *)0x1) goto LAB_00c1f62e;
      if (moveDown == (Move *)0x0) {
        for (; (uint)xHigh_local < table->subtables[xHigh_local].next;
            xHigh_local = table->subtables[xHigh_local].next) {
        }
        initGroupSize = table->subtables[xHigh_local].next;
      }
      else {
        xHigh_local = moveDown->x;
        initGroupSize = table->subtables[xHigh_local].next;
      }
      iVar6 = xHigh_local - initGroupSize;
      _result = (DdNode *)ddSymmSiftingDown(table,xHigh_local,xHigh);
      if (_result == (DdNode *)0x1) goto LAB_00c1f62e;
      if (_result == (DdNode *)0x0) {
        initGroupSize = xHigh_local;
        xHigh_local = table->subtables[xHigh_local].next;
      }
      else {
        xHigh_local = _result->ref;
        for (initGroupSize = xHigh_local; (uint)initGroupSize < table->subtables[initGroupSize].next
            ; initGroupSize = table->subtables[initGroupSize].next) {
        }
      }
      if (iVar6 + 1 == (initGroupSize - xHigh_local) + 1) {
        iVar5 = ddSymmSiftingBackward(table,(Move *)_result,iVar5);
      }
      else {
        while (moveDown != (Move *)0x0) {
          pMVar4 = moveDown->next;
          moveDown->y = 0;
          *(DdNode **)&moveDown->flags = table->nextFree;
          table->nextFree = (DdNode *)moveDown;
          moveDown = pMVar4;
        }
        uVar2 = table->keys;
        iVar5 = table->isolated;
        moveDown = ddSymmSiftingUp(table,xHigh_local,xLow);
        iVar5 = ddSymmSiftingBackward(table,moveDown,uVar2 - iVar5);
      }
    }
  }
  if (iVar5 != 0) {
    while (_result != (DdNode *)0x0) {
      pDVar3 = (_result->type).kids.T;
      _result->ref = 0;
      _result->next = table->nextFree;
      table->nextFree = _result;
      _result = pDVar3;
    }
    while (moveDown != (Move *)0x0) {
      pMVar4 = moveDown->next;
      moveDown->y = 0;
      *(DdNode **)&moveDown->flags = table->nextFree;
      table->nextFree = (DdNode *)moveDown;
      moveDown = pMVar4;
    }
    return 1;
  }
LAB_00c1f62e:
  if (_result != (DdNode *)0x1) {
    while (_result != (DdNode *)0x0) {
      pDVar3 = (_result->type).kids.T;
      _result->ref = 0;
      _result->next = table->nextFree;
      table->nextFree = _result;
      _result = pDVar3;
    }
  }
  if (moveDown != (Move *)0x1) {
    while (moveDown != (Move *)0x0) {
      pMVar4 = moveDown->next;
      moveDown->y = 0;
      *(DdNode **)&moveDown->flags = table->nextFree;
      table->nextFree = (DdNode *)moveDown;
      moveDown = pMVar4;
    }
  }
  return 0;
}

Assistant:

static int
ddSymmSiftingAux(
  DdManager * table,
  int  x,
  int  xLow,
  int  xHigh)
{
    Move *move;
    Move *moveUp;       /* list of up moves */
    Move *moveDown;     /* list of down moves */
    int  initialSize;
    int  result;
    int  i;
    int  topbot;        /* index to either top or bottom of symmetry group */
    int  initGroupSize, finalGroupSize;


#ifdef DD_DEBUG
    /* check for previously detected symmetry */
    assert(table->subtables[x].next == (unsigned) x);
#endif

    initialSize = table->keys - table->isolated;

    moveDown = NULL;
    moveUp = NULL;

    if ((x - xLow) > (xHigh - x)) {
        /* Will go down first, unless x == xHigh:
        ** Look for consecutive symmetries above x.
        */
        for (i = x; i > xLow; i--) {
            if (!cuddSymmCheck(table,i-1,i))
                break;
            topbot = table->subtables[i-1].next; /* find top of i-1's group */
            table->subtables[i-1].next = i;
            table->subtables[x].next = topbot; /* x is bottom of group so its */
                                               /* next is top of i-1's group */
            i = topbot + 1; /* add 1 for i--; new i is top of symm group */
        }
    } else {
        /* Will go up first unless x == xlow:
        ** Look for consecutive symmetries below x.
        */
        for (i = x; i < xHigh; i++) {
            if (!cuddSymmCheck(table,i,i+1))
                break;
            /* find bottom of i+1's symm group */
            topbot = i + 1;
            while ((unsigned) topbot < table->subtables[topbot].next) {
                topbot = table->subtables[topbot].next;
            }
            table->subtables[topbot].next = table->subtables[i].next;
            table->subtables[i].next = i + 1;
            i = topbot - 1; /* subtract 1 for i++; new i is bottom of group */
        }
    }

    /* Now x may be in the middle of a symmetry group.
    ** Find bottom of x's symm group.
    */
    while ((unsigned) x < table->subtables[x].next)
        x = table->subtables[x].next;

    if (x == xLow) { /* Sift down */

#ifdef DD_DEBUG
        /* x must be a singleton */
        assert((unsigned) x == table->subtables[x].next);
#endif
        if (x == xHigh) return(1);      /* just one variable */

        initGroupSize = 1;

        moveDown = ddSymmSiftingDown(table,x,xHigh);
            /* after this point x --> xHigh, unless early term */
        if (moveDown == MV_OOM) goto ddSymmSiftingAuxOutOfMem;
        if (moveDown == NULL) return(1);

        x = moveDown->y;
        /* Find bottom of x's group */
        i = x;
        while ((unsigned) i < table->subtables[i].next) {
            i = table->subtables[i].next;
        }
#ifdef DD_DEBUG
        /* x should be the top of the symmetry group and i the bottom */
        assert((unsigned) i >= table->subtables[i].next);
        assert((unsigned) x == table->subtables[i].next);
#endif
        finalGroupSize = i - x + 1;

        if (initGroupSize == finalGroupSize) {
            /* No new symmetry groups detected, return to best position */
            result = ddSymmSiftingBackward(table,moveDown,initialSize);
        } else {
            initialSize = table->keys - table->isolated;
            moveUp = ddSymmSiftingUp(table,x,xLow);
            result = ddSymmSiftingBackward(table,moveUp,initialSize);
        }
        if (!result) goto ddSymmSiftingAuxOutOfMem;

    } else if (cuddNextHigh(table,x) > xHigh) { /* Sift up */
        /* Find top of x's symm group */
        i = x;                          /* bottom */
        x = table->subtables[x].next;   /* top */

        if (x == xLow) return(1); /* just one big group */

        initGroupSize = i - x + 1;

        moveUp = ddSymmSiftingUp(table,x,xLow);
            /* after this point x --> xLow, unless early term */
        if (moveUp == MV_OOM) goto ddSymmSiftingAuxOutOfMem;
        if (moveUp == NULL) return(1);

        x = moveUp->x;
        /* Find top of x's group */
        i = table->subtables[x].next;
#ifdef DD_DEBUG
        /* x should be the bottom of the symmetry group and i the top */
        assert((unsigned) x >= table->subtables[x].next);
        assert((unsigned) i == table->subtables[x].next);
#endif
        finalGroupSize = x - i + 1;

        if (initGroupSize == finalGroupSize) {
            /* No new symmetry groups detected, return to best position */
            result = ddSymmSiftingBackward(table,moveUp,initialSize);
        } else {
            initialSize = table->keys - table->isolated;
            moveDown = ddSymmSiftingDown(table,x,xHigh);
            result = ddSymmSiftingBackward(table,moveDown,initialSize);
        }
        if (!result) goto ddSymmSiftingAuxOutOfMem;

    } else if ((x - xLow) > (xHigh - x)) { /* must go down first: shorter */

        moveDown = ddSymmSiftingDown(table,x,xHigh);
        /* at this point x == xHigh, unless early term */
        if (moveDown == MV_OOM) goto ddSymmSiftingAuxOutOfMem;

        if (moveDown != NULL) {
            x = moveDown->y;    /* x is top here */
            i = x;
            while ((unsigned) i < table->subtables[i].next) {
                i = table->subtables[i].next;
            }
        } else {
            i = x;
            while ((unsigned) i < table->subtables[i].next) {
                i = table->subtables[i].next;
            }
            x = table->subtables[i].next;
        }
#ifdef DD_DEBUG
        /* x should be the top of the symmetry group and i the bottom */
        assert((unsigned) i >= table->subtables[i].next);
        assert((unsigned) x == table->subtables[i].next);
#endif
        initGroupSize = i - x + 1;

        moveUp = ddSymmSiftingUp(table,x,xLow);
        if (moveUp == MV_OOM) goto ddSymmSiftingAuxOutOfMem;

        if (moveUp != NULL) {
            x = moveUp->x;
            i = table->subtables[x].next;
        } else {
            i = x;
            while ((unsigned) x < table->subtables[x].next)
                x = table->subtables[x].next;
        }
#ifdef DD_DEBUG
        /* x should be the bottom of the symmetry group and i the top */
        assert((unsigned) x >= table->subtables[x].next);
        assert((unsigned) i == table->subtables[x].next);
#endif
        finalGroupSize = x - i + 1;

        if (initGroupSize == finalGroupSize) {
            /* No new symmetry groups detected, return to best position */
            result = ddSymmSiftingBackward(table,moveUp,initialSize);
        } else {
            while (moveDown != NULL) {
                move = moveDown->next;
                cuddDeallocMove(table, moveDown);
                moveDown = move;
            }
            initialSize = table->keys - table->isolated;
            moveDown = ddSymmSiftingDown(table,x,xHigh);
            result = ddSymmSiftingBackward(table,moveDown,initialSize);
        }
        if (!result) goto ddSymmSiftingAuxOutOfMem;

    } else { /* moving up first: shorter */
        /* Find top of x's symmetry group */
        x = table->subtables[x].next;

        moveUp = ddSymmSiftingUp(table,x,xLow);
        /* at this point x == xHigh, unless early term */
        if (moveUp == MV_OOM) goto ddSymmSiftingAuxOutOfMem;

        if (moveUp != NULL) {
            x = moveUp->x;
            i = table->subtables[x].next;
        } else {
            while ((unsigned) x < table->subtables[x].next)
                x = table->subtables[x].next;
            i = table->subtables[x].next;
        }
#ifdef DD_DEBUG
        /* x is bottom of the symmetry group and i is top */
        assert((unsigned) x >= table->subtables[x].next);
        assert((unsigned) i == table->subtables[x].next);
#endif
        initGroupSize = x - i + 1;

        moveDown = ddSymmSiftingDown(table,x,xHigh);
        if (moveDown == MV_OOM) goto ddSymmSiftingAuxOutOfMem;

        if (moveDown != NULL) {
            x = moveDown->y;
            i = x;
            while ((unsigned) i < table->subtables[i].next) {
                i = table->subtables[i].next;
            }
        } else {
            i = x;
            x = table->subtables[x].next;
        }
#ifdef DD_DEBUG
        /* x should be the top of the symmetry group and i the bottom */
        assert((unsigned) i >= table->subtables[i].next);
        assert((unsigned) x == table->subtables[i].next);
#endif
        finalGroupSize = i - x + 1;

        if (initGroupSize == finalGroupSize) {
            /* No new symmetries detected, go back to best position */
            result = ddSymmSiftingBackward(table,moveDown,initialSize);
        } else {
            while (moveUp != NULL) {
                move = moveUp->next;
                cuddDeallocMove(table, moveUp);
                moveUp = move;
            }
            initialSize = table->keys - table->isolated;
            moveUp = ddSymmSiftingUp(table,x,xLow);
            result = ddSymmSiftingBackward(table,moveUp,initialSize);
        }
        if (!result) goto ddSymmSiftingAuxOutOfMem;
    }

    while (moveDown != NULL) {
        move = moveDown->next;
        cuddDeallocMove(table, moveDown);
        moveDown = move;
    }
    while (moveUp != NULL) {
        move = moveUp->next;
        cuddDeallocMove(table, moveUp);
        moveUp = move;
    }

    return(1);

ddSymmSiftingAuxOutOfMem:
    if (moveDown != MV_OOM) {
        while (moveDown != NULL) {
            move = moveDown->next;
            cuddDeallocMove(table, moveDown);
            moveDown = move;
        }
    }
    if (moveUp != MV_OOM) {
        while (moveUp != NULL) {
            move = moveUp->next;
            cuddDeallocMove(table, moveUp);
            moveUp = move;
        }
    }

    return(0);

}